

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFEmbeddedFontWriter.cpp
# Opt level: O3

EStatusCode __thiscall
CFFEmbeddedFontWriter::WriteTopDictSegment
          (CFFEmbeddedFontWriter *this,MyStringBuf *ioTopDictSegment)

{
  _Rb_tree_header *p_Var1;
  undefined2 uVar2;
  TopDictInfo *pTVar3;
  EStatusCode EVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  LongFilePositionType LVar8;
  _Base_ptr p_Var9;
  CFFPrimitiveWriter dictPrimitiveWriter;
  OutputStringBufferStream topDictStream;
  stringstream formatter;
  CFFPrimitiveWriter local_200;
  OutputStringBufferStream local_1f0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  OutputStringBufferStream::OutputStringBufferStream(&local_1f0,ioTopDictSegment);
  CFFPrimitiveWriter::CFFPrimitiveWriter(&local_200,(IByteWriter *)0x0);
  CFFPrimitiveWriter::SetStream(&local_200,(IByteWriter *)&local_1f0);
  pTVar3 = (this->mOpenTypeInput).mCFF.mTopDictIndex;
  p_Var6 = (pTVar3->mTopDict)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(pTVar3->mTopDict)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  p_Var9 = &p_Var1->_M_header;
  if (p_Var6 != (_Base_ptr)0x0) {
    do {
      uVar2 = (undefined2)p_Var6[1]._M_color;
      if (0xc1d < (ushort)uVar2) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(ushort)uVar2 < 0xc1e];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
       (p_Var9 = p_Var5, 0xc1e < (ushort)(short)p_Var5[1]._M_color)) {
      p_Var9 = &p_Var1->_M_header;
    }
  }
  if (this->mIsCID == true) {
    CFFPrimitiveWriter::WriteDictItems
              (&local_200,(short)p_Var9[1]._M_color,(DictOperandList *)&p_Var9[1]._M_parent);
  }
  p_Var6 = (pTVar3->mTopDict)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      uVar2 = (undefined2)p_Var6[1]._M_color;
      if ((3 < (ushort)uVar2 - 0xf) &&
         ((7 < (ushort)uVar2 - 0xc1e || ((0xc1U >> ((ushort)uVar2 - 0xc1e & 0x1f) & 1) == 0)))) {
        CFFPrimitiveWriter::WriteDictItems(&local_200,uVar2,(DictOperandList *)&p_Var6[1]._M_parent)
        ;
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  p_Var6 = (pTVar3->mTopDict)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var6 == (_Base_ptr)0x0) {
LAB_001fd08a:
    if ((this->mOpenTypeInput).mOS2Exists == true) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"/FSType ",8);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," def",4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)&this->mOptionalEmbeddedPostscript,(string *)local_1d8);
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      CFFPrimitiveWriter::WriteIntegerOperand
                (&local_200,(ulong)(this->mOpenTypeInput).mCFF.mStringsCount + 0x187);
      CFFPrimitiveWriter::WriteDictOperator(&local_200,0xc15);
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      goto LAB_001fd180;
    }
  }
  else {
    do {
      if (0xc14 < (ushort)*(size_t *)(p_Var6 + 1)) {
        p_Var5 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[(ushort)*(size_t *)(p_Var6 + 1) < 0xc15];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 == p_Var1) ||
       (0xc15 < (ushort)((_Rb_tree_header *)p_Var5)->_M_node_count)) goto LAB_001fd08a;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->mOptionalEmbeddedPostscript,0,
             (char *)(this->mOptionalEmbeddedPostscript)._M_string_length,0x33600a);
LAB_001fd180:
  LVar8 = OutputStringBufferStream::GetCurrentPosition(&local_1f0);
  this->mCharsetPlaceHolderPosition = LVar8;
  CFFPrimitiveWriter::Pad5Bytes(&local_200);
  CFFPrimitiveWriter::WriteDictOperator(&local_200,0xf);
  LVar8 = OutputStringBufferStream::GetCurrentPosition(&local_1f0);
  this->mCharstringsPlaceHolderPosition = LVar8;
  CFFPrimitiveWriter::Pad5Bytes(&local_200);
  CFFPrimitiveWriter::WriteDictOperator(&local_200,0x11);
  if (((this->mOpenTypeInput).mCFF.mPrivateDicts)->mPrivateDictStart == 0) {
    this->mPrivatePlaceHolderPosition = 0;
  }
  else {
    LVar8 = OutputStringBufferStream::GetCurrentPosition(&local_1f0);
    this->mPrivatePlaceHolderPosition = LVar8;
    CFFPrimitiveWriter::Pad5Bytes(&local_200);
    CFFPrimitiveWriter::Pad5Bytes(&local_200);
    CFFPrimitiveWriter::WriteDictOperator(&local_200,0x12);
  }
  if (this->mIsCID == true) {
    this->mEncodingPlaceHolderPosition = 0;
    LVar8 = OutputStringBufferStream::GetCurrentPosition(&local_1f0);
    this->mFDArrayPlaceHolderPosition = LVar8;
    CFFPrimitiveWriter::Pad5Bytes(&local_200);
    CFFPrimitiveWriter::WriteDictOperator(&local_200,0xc24);
    LVar8 = OutputStringBufferStream::GetCurrentPosition(&local_1f0);
    this->mFDSelectPlaceHolderPosition = LVar8;
    CFFPrimitiveWriter::Pad5Bytes(&local_200);
    CFFPrimitiveWriter::WriteDictOperator(&local_200,0xc25);
  }
  else {
    LVar8 = OutputStringBufferStream::GetCurrentPosition(&local_1f0);
    this->mEncodingPlaceHolderPosition = LVar8;
    CFFPrimitiveWriter::Pad5Bytes(&local_200);
    CFFPrimitiveWriter::WriteDictOperator(&local_200,0x10);
    this->mFDArrayPlaceHolderPosition = 0;
    this->mFDSelectPlaceHolderPosition = 0;
  }
  EVar4 = CFFPrimitiveWriter::GetInternalState(&local_200);
  CFFPrimitiveWriter::~CFFPrimitiveWriter(&local_200);
  OutputStringBufferStream::~OutputStringBufferStream(&local_1f0);
  return EVar4;
}

Assistant:

EStatusCode CFFEmbeddedFontWriter::WriteTopDictSegment(MyStringBuf& ioTopDictSegment)
{
	OutputStringBufferStream topDictStream(&ioTopDictSegment);
	CFFPrimitiveWriter dictPrimitiveWriter;
	UShortToDictOperandListMap::iterator itROS;
	UShortToDictOperandListMap::iterator it;
	dictPrimitiveWriter.SetStream(&topDictStream);

	UShortToDictOperandListMap& originalTopDictRef = mOpenTypeInput.mCFF.mTopDictIndex[0].mTopDict;

	itROS = originalTopDictRef.find(scROS);

	 // make sure to write ROS first, if one exists
	if(mIsCID)
		dictPrimitiveWriter.WriteDictItems(itROS->first,itROS->second);

	// write all keys, excluding those that we want to write on our own
	for(it = originalTopDictRef.begin(); it != originalTopDictRef.end();++it)
	{
		if(	it->first != scROS &&
			it->first != scCharset &&
			it->first != scEncoding &&
			it->first != scCharstrings &&
			it->first != scPrivate &&
			it->first != scFDArray &&
			it->first != scFDSelect)
				dictPrimitiveWriter.WriteDictItems(it->first,it->second);
	}
	// check if it had an embedded postscript (which would normally be the FSType implementation).
	// if not...create one to implement the FSType
	if(originalTopDictRef.find(scEmbeddedPostscript) == originalTopDictRef.end() && mOpenTypeInput.mOS2Exists)
	{
		// no need for sophistication here...you can consider this as the only string to be added.
		// so can be sure that its index would be the current count 
		std::stringstream formatter;
		formatter<<"/FSType "<<mOpenTypeInput.mOS2.fsType<<" def";
		mOptionalEmbeddedPostscript = formatter.str();
		dictPrimitiveWriter.WriteIntegerOperand(mOpenTypeInput.mCFF.mStringsCount + N_STD_STRINGS);
		dictPrimitiveWriter.WriteDictOperator(scEmbeddedPostscript);
	}
	else
		mOptionalEmbeddedPostscript = "";

	// now leave placeholders, record their positions
	mCharsetPlaceHolderPosition = topDictStream.GetCurrentPosition();
	dictPrimitiveWriter.Pad5Bytes();
	dictPrimitiveWriter.WriteDictOperator(scCharset);
	mCharstringsPlaceHolderPosition = topDictStream.GetCurrentPosition();
	dictPrimitiveWriter.Pad5Bytes();
	dictPrimitiveWriter.WriteDictOperator(scCharstrings);
	if(mOpenTypeInput.mCFF.mPrivateDicts[0].mPrivateDictStart != 0)
	{
		mPrivatePlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes(); // for private it's two places - size and position
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scPrivate);
	}
	else
	{
		mPrivatePlaceHolderPosition = 0;
	}
	if(mIsCID)
	{
		mEncodingPlaceHolderPosition = 0;
		mFDArrayPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scFDArray);
		mFDSelectPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scFDSelect);
	}
	else
	{
		mEncodingPlaceHolderPosition = topDictStream.GetCurrentPosition();
		dictPrimitiveWriter.Pad5Bytes();
		dictPrimitiveWriter.WriteDictOperator(scEncoding);
		mFDArrayPlaceHolderPosition = 0;
		mFDSelectPlaceHolderPosition = 0;
	}
	return dictPrimitiveWriter.GetInternalState();
}